

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  sexp_conflict psVar1;
  
  sexp_scheme_init();
  psVar1 = run_main(argc,argv);
  if (((ulong)psVar1 & 1) != 0) {
    return (int)((ulong)psVar1 >> 1);
  }
  if (psVar1 == (sexp_conflict)&DAT_0000003e) {
    exit(0x46);
  }
  exit(0);
}

Assistant:

int main (int argc, char **argv) {
  sexp res;
#if SEXP_USE_PRINT_BACKTRACE_ON_SEGFAULT
  signal(SIGSEGV, sexp_segfault_handler); 
#endif
  sexp_scheme_init();
  res = run_main(argc, argv);
  if (sexp_fixnump(res)) {
    int code = sexp_unbox_fixnum(res);
#ifdef PLAN9
    if (code == 0) {
      exit_success();
    } else {
      exit_failure();
    }
#else
    return code;
#endif
  } else if (res == SEXP_FALSE) {
    exit_failure();
  } else {
    exit_success();
  }
  return 0;
}